

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool __thiscall
basist::ktx2_transcoder::decompress_level_data
          (ktx2_transcoder *this,uint32_t level_index,uint8_vec *uncomp_data)

{
  uint min_new_capacity;
  uint uVar1;
  bool bVar2;
  uint32_t new_size;
  
  if ((this->m_levels).m_size <= level_index) {
    __assert_fail("i < m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x178,
                  "T &basisu::vector<basist::ktx2_level_index>::operator[](size_t) [T = basist::ktx2_level_index]"
                 );
  }
  min_new_capacity = *(uint *)(this->m_levels).m_p[level_index].m_uncompressed_byte_length.m_bytes;
  uVar1 = uncomp_data->m_size;
  if (uVar1 != min_new_capacity) {
    if (uVar1 <= min_new_capacity) {
      if ((uncomp_data->m_capacity < min_new_capacity) &&
         (bVar2 = basisu::elemental_vector::increase_capacity
                            ((elemental_vector *)uncomp_data,min_new_capacity,
                             uVar1 + 1 == min_new_capacity,1,(object_mover)0x0,true), !bVar2)) {
        return false;
      }
      memset(uncomp_data->m_p + uncomp_data->m_size,0,
             (ulong)(min_new_capacity - uncomp_data->m_size));
    }
    uncomp_data->m_size = min_new_capacity;
  }
  return *(int *)(this->m_header).m_supercompression_scheme.m_bytes != 2;
}

Assistant:

inline void set_inten_table(uint32_t subblock_id, uint32_t t)
		{
			assert(subblock_id < 2);
			assert(t < 8);
			const uint32_t ofs = subblock_id ? 2 : 5;
			m_bytes[3] &= ~(7 << ofs);
			m_bytes[3] |= (t << ofs);
		}